

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_null_implementation.cpp
# Opt level: O0

hrgls_Status __thiscall hrgls::API::GetStatus(API *this)

{
  API_private *pAVar1;
  mapped_type *pmVar2;
  key_type local_30;
  key_type local_28;
  hrgls_Status local_1c;
  API *pAStack_18;
  hrgls_Status ret;
  API *this_local;
  
  if (this->m_private == (API_private *)0x0) {
    this_local._4_4_ = 0x3ee;
  }
  else {
    pAVar1 = this->m_private;
    pAStack_18 = this;
    local_28._M_thread = (native_handle_type)std::this_thread::get_id();
    pmVar2 = std::
             map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
             ::operator[](&pAVar1->status,&local_28);
    local_1c = *pmVar2;
    pAVar1 = this->m_private;
    local_30._M_thread = (native_handle_type)std::this_thread::get_id();
    pmVar2 = std::
             map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
             ::operator[](&pAVar1->status,&local_30);
    *pmVar2 = 0;
    this_local._4_4_ = local_1c;
  }
  return this_local._4_4_;
}

Assistant:

hrgls_Status API::GetStatus()
  {
    if (!m_private) {
      return hrgls_STATUS_NULL_OBJECT_POINTER;
    } else {
      hrgls_Status ret = m_private->status[std::this_thread::get_id()];
      m_private->status[std::this_thread::get_id()] = hrgls_STATUS_OKAY;
      return ret;
    }
  }